

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O0

bool __thiscall Json::JsonArray::put(JsonArray *this,JsonValue *jsonValue)

{
  bool bVar1;
  shared_ptr<Json::JsonValue> local_40;
  __normal_iterator<std::shared_ptr<Json::JsonValue>_*,_std::vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>_>
  local_30;
  __normal_iterator<const_std::shared_ptr<Json::JsonValue>_*,_std::vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>_>
  local_28;
  JsonValue *local_20;
  JsonValue *jsonValue_local;
  JsonArray *this_local;
  
  if (jsonValue == (JsonValue *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_20 = jsonValue;
    jsonValue_local = &this->super_JsonValue;
    local_28._M_current = (shared_ptr<Json::JsonValue> *)find(this,jsonValue);
    local_30._M_current =
         (shared_ptr<Json::JsonValue> *)
         std::
         vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
         ::end(&this->__lstJsonArray);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      (*local_20->_vptr_JsonValue[6])
                (local_20,(ulong)((byte)(this->super_JsonFormatter).field_0x26 & 1));
      std::shared_ptr<Json::JsonValue>::shared_ptr<Json::JsonValue,void>(&local_40,local_20);
      std::
      vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>::
      push_back(&this->__lstJsonArray,&local_40);
      std::shared_ptr<Json::JsonValue>::~shared_ptr(&local_40);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Json::JsonArray::put(JsonValue *jsonValue) {
    if (!jsonValue) return false;
    if (find(jsonValue) != __lstJsonArray.end())return false;
    jsonValue->setEscapeChar(__escape);
    __lstJsonArray.push_back(std::shared_ptr<JsonValue>(jsonValue));
    return true;
}